

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O0

void google::protobuf::internal::TcParser::ReportFastUtf8Error
               (uint32_t decoded_tag,TcParseTableBase *table)

{
  FieldEntry *field_entry;
  string_view sVar1;
  string_view sVar2;
  string_view field_name;
  char *local_40;
  internal *local_38;
  char *local_30;
  FieldEntry *entry;
  uint32_t field_num;
  TcParseTableBase *table_local;
  uint32_t decoded_tag_local;
  
  field_entry = FindFieldEntry(table,decoded_tag >> 3);
  sVar1 = MessageName(table);
  sVar2 = FieldName(table,field_entry);
  local_38 = (internal *)sVar1._M_len;
  local_30 = sVar1._M_str;
  local_40 = sVar2._M_str;
  sVar1._M_str = (char *)sVar2._M_len;
  sVar1._M_len = (size_t)local_30;
  field_name._M_str = "parsing";
  field_name._M_len = (size_t)local_40;
  PrintUTF8ErrorLog(local_38,sVar1,field_name,(char *)0x0,sVar2._M_len._0_1_);
  return;
}

Assistant:

void TcParser::ReportFastUtf8Error(uint32_t decoded_tag,
                                   const TcParseTableBase* table) {
  uint32_t field_num = decoded_tag >> 3;
  const auto* entry = FindFieldEntry(table, field_num);
  PrintUTF8ErrorLog(MessageName(table), FieldName(table, entry), "parsing",
                    false);
}